

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O0

_Bool pool_buffer_set_c_array(chck_pool_buffer *pb,void *items,size_t memb)

{
  _Bool _Var1;
  size_t local_28;
  size_t memb_local;
  void *items_local;
  chck_pool_buffer *pb_local;
  
  if (pb == (chck_pool_buffer *)0x0) {
    __assert_fail("pb",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c"
                  ,0xe1,
                  "_Bool pool_buffer_set_c_array(struct chck_pool_buffer *, const void *, size_t)");
  }
  if ((items == (void *)0x0) || (memb == 0)) {
    pool_buffer_release(pb);
    local_28 = 0;
  }
  else {
    _Var1 = pool_buffer_resize_mul(pb,memb,pb->member);
    if (!_Var1) {
      return false;
    }
    memcpy(pb->buffer,items,pb->allocated);
    local_28 = memb;
  }
  pb->used = pb->allocated;
  pb->count = local_28;
  return true;
}

Assistant:

static bool
pool_buffer_set_c_array(struct chck_pool_buffer *pb, const void *items, size_t memb)
{
   assert(pb);

   if (items && memb > 0) {
      if (!pool_buffer_resize_mul(pb, memb, pb->member))
         return false;

      memcpy(pb->buffer, items, pb->allocated);
   } else {
      pool_buffer_release(pb);
      memb = 0;
   }

   pb->used = pb->allocated;
   pb->count = memb;
   return true;
}